

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdDecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  char (*pacVar1) [32];
  undefined4 *puVar2;
  uint *puVar3;
  word wVar4;
  __time_t _Var5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  int i;
  int iVar8;
  int iVar9;
  int v;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  word *pwVar16;
  undefined1 *puVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  timespec *ptVar21;
  ulong *puVar22;
  char (*pacVar23) [32];
  ulong uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  __time_t *p_Var28;
  word *pwVar29;
  ulong *puVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int u;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  uint uVar44;
  uint uVar45;
  char pBuffer [10];
  timespec ts;
  char local_4c0 [16];
  long local_4b0;
  int local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  long local_490;
  __time_t *local_488;
  ulong *local_480;
  ulong *local_478;
  __time_t *local_470;
  __time_t *local_468;
  ulong *local_460;
  __time_t *local_458;
  ulong local_450;
  char (*local_448) [8];
  word *local_440;
  timespec local_438 [32];
  ulong local_238 [65];
  
  uVar24 = (ulong)(uint)nVars;
  iVar8 = clock_gettime(3,local_438);
  if (iVar8 < 0) {
    local_4b0 = 1;
  }
  else {
    lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_438[0].tv_nsec),8);
    local_4b0 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_438[0].tv_sec * -1000000;
  }
  pacVar1 = p->Cache;
  local_448 = p->pVarDefs;
  local_4a8 = -0x80000000;
  uStack_4a4 = 0x80000000;
  uStack_4a0 = 0x80000000;
  uStack_49c = 0x80000000;
  local_440 = pTruth;
  do {
    uVar32 = uVar24 - 1;
    if (1 < (int)uVar24) {
      uVar34 = (int)uVar24 - 2;
      uVar15 = uVar24;
      do {
        uVar10 = uVar32;
        iVar8 = (int)uVar15 + -7;
        uVar31 = 1 << ((byte)iVar8 & 0x1f);
        iVar25 = 2 << ((byte)iVar8 & 0x1f);
        uVar36 = (ulong)uVar34;
        lVar19 = (long)(int)uVar31;
        uVar32 = 1;
        if (1 < (int)uVar31) {
          uVar32 = (ulong)uVar31;
        }
        uVar33 = uVar10 & 0xffffffff;
        local_490 = lVar19 * 8;
        local_458 = &local_438[0].tv_sec + lVar19;
        local_460 = local_238 + lVar19;
        local_480 = local_238 + lVar19;
        local_468 = &local_438[0].tv_sec + lVar19;
        local_488 = &local_438[0].tv_sec + lVar19;
        local_470 = &local_438[0].tv_sec + lVar19;
        local_478 = local_238 + lVar19;
        local_450 = uVar36;
        do {
          u = (int)uVar36;
          v = (int)uVar10;
          if (pacVar1[pVars[uVar33]][pVars[uVar36]] == '\0') {
            local_4c0[8] = '\0';
            local_4c0[9] = '\0';
            local_4c0[0] = '\0';
            local_4c0[1] = '\0';
            local_4c0[2] = '\0';
            local_4c0[3] = '\0';
            local_4c0[4] = '\0';
            local_4c0[5] = '\0';
            local_4c0[6] = '\0';
            local_4c0[7] = '\0';
            uVar31 = (uint)uVar24;
            uVar34 = 1 << ((char)uVar24 - 6U & 0x1f);
            if ((int)uVar31 < 7) {
              uVar34 = 1;
            }
            uVar24 = (ulong)uVar34;
            iVar9 = Dau_DsdFindSupportOne(p,pTruth,pVars,uVar31,v,u);
            if (v <= u) {
              __assert_fail("v > u",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                            ,0x647,
                            "int Dau_DsdDecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                           );
            }
            bVar13 = (byte)uVar36;
            bVar12 = (byte)(1 << ((byte)uVar10 & 0x1f));
            uVar37 = uVar31;
            if (iVar9 == 1) {
              iVar9 = Abc_TtCheckEqualCofs(pTruth,uVar34,u,v,0,3);
              if (iVar9 == 0) {
                iVar9 = Abc_TtCheckEqualCofs(pTruth,uVar34,u,v,1,3);
                if (iVar9 == 0) goto LAB_004a23aa;
                sprintf(local_4c0,"(!%c!%c)",(ulong)(pVars[uVar33] + 0x61),
                        (ulong)(pVars[uVar36] + 0x61));
                auVar7 = _DAT_007ee2e0;
                if (uVar34 == 1) {
                  uVar20 = s_Truths6[uVar33] & *pTruth;
                  uVar20 = (uVar20 >> (bVar12 & 0x3f) | uVar20) & s_Truths6[uVar36];
                  bVar13 = (byte)(1 << (bVar13 & 0x1f));
                  uVar27 = *pTruth & s_Truths6Neg[uVar33];
                  uVar27 = (uVar27 << (bVar12 & 0x3f) | uVar27) & s_Truths6Neg[uVar36];
                  local_438[0].tv_sec = uVar20 >> (bVar13 & 0x3f) | uVar20;
                  local_238[0] = uVar27 << (bVar13 & 0x3f) | uVar27;
                }
                else {
                  if (uVar15 < 7) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6[uVar33];
                      uVar27 = 0;
                      do {
                        (&local_438[0].tv_sec)[uVar27] =
                             (pTruth[uVar27] & uVar20) >> (bVar12 & 0x3f) | pTruth[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    ptVar21 = local_438;
                    pwVar16 = pTruth;
                    do {
                      if (iVar8 != 0x1f) {
                        uVar20 = 0;
                        do {
                          _Var5 = *(__time_t *)((long)pwVar16 + uVar20 * 8 + local_490);
                          (&ptVar21->tv_sec)[uVar20] = _Var5;
                          *(__time_t *)((long)&ptVar21->tv_sec + uVar20 * 8 + local_490) = _Var5;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pwVar16 = pwVar16 + iVar25;
                      ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar25);
                    } while (pwVar16 < pTruth + (int)uVar34);
                  }
                  if (u < 6) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6[uVar36];
                      uVar27 = 0;
                      do {
                        uVar35 = (&local_438[0].tv_sec)[uVar27] & uVar20;
                        (&local_438[0].tv_sec)[uVar27] =
                             uVar35 >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar35;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    bVar14 = (byte)(u + -6);
                    uVar37 = 1 << (bVar14 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar37) {
                      uVar20 = (ulong)uVar37;
                    }
                    ptVar21 = local_438;
                    do {
                      if (u + -6 != 0x1f) {
                        uVar27 = 0;
                        do {
                          (&ptVar21->tv_sec)[uVar27] =
                               (&ptVar21->tv_sec)[(long)(int)uVar37 + uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      ptVar21 = (timespec *)(&ptVar21->tv_sec + (2 << (bVar14 & 0x1f)));
                    } while (ptVar21 < (timespec *)(&local_438[0].tv_sec + (int)uVar34));
                  }
                  if (uVar15 < 7) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar33];
                      uVar27 = 0;
                      do {
                        local_238[uVar27] =
                             (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) | pTruth[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    pwVar16 = pTruth;
                    puVar22 = local_238;
                    puVar30 = local_480;
                    do {
                      if (iVar8 != 0x1f) {
                        uVar20 = 0;
                        do {
                          uVar27 = pwVar16[uVar20];
                          puVar22[uVar20] = uVar27;
                          puVar30[uVar20] = uVar27;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pwVar16 = pwVar16 + iVar25;
                      puVar30 = puVar30 + iVar25;
                      puVar22 = puVar22 + iVar25;
                    } while (pwVar16 < pTruth + (int)uVar34);
                  }
                  if (u < 6) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar36];
                      uVar27 = 0;
                      do {
                        local_238[uVar27] =
                             (local_238[uVar27] & uVar20) << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                             local_238[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    bVar13 = (byte)(u + -6);
                    uVar37 = 1 << (bVar13 & 0x1f);
                    iVar9 = 2 << (bVar13 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar37) {
                      uVar20 = (ulong)uVar37;
                    }
                    puVar22 = local_238 + (int)uVar37;
                    puVar30 = local_238;
                    do {
                      if (u + -6 != 0x1f) {
                        uVar27 = 0;
                        do {
                          puVar22[uVar27] = puVar30[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      puVar30 = puVar30 + iVar9;
                      puVar22 = puVar22 + iVar9;
                    } while (puVar30 < local_238 + (int)uVar34);
                  }
                }
                if (Dau_DsdTtElems_pTtElems == 0) {
                  lVar19 = 1;
                  puVar17 = Dau_DsdTtElems_TtElems;
                  auVar42 = _DAT_007ee2d0;
                  do {
                    if (SUB164(auVar42 ^ auVar7,4) == local_4a8 &&
                        SUB164(auVar42 ^ auVar7,0) < -0x7ffffff3) {
                      *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar19 * 8 + 0x19f8) = puVar17;
                      (&Dau_DsdTtElems_pTtElems)[lVar19] = (long)(puVar17 + 0x200);
                    }
                    lVar18 = auVar42._8_8_;
                    auVar42._0_8_ = auVar42._0_8_ + 2;
                    auVar42._8_8_ = lVar18 + 2;
                    lVar19 = lVar19 + 2;
                    puVar17 = puVar17 + 0x400;
                  } while (lVar19 != 0xf);
                  uVar20 = 0;
                  do {
                    lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar20];
                    if (uVar20 < 6) {
                      wVar4 = s_Truths6[uVar20];
                      uVar6 = *(undefined4 *)((long)s_Truths6 + uVar20 * 8 + 4);
                      lVar18 = 0;
                      do {
                        puVar2 = (undefined4 *)(lVar19 + lVar18 * 8);
                        *puVar2 = (int)wVar4;
                        puVar2[1] = uVar6;
                        puVar2[2] = (int)wVar4;
                        puVar2[3] = uVar6;
                        lVar18 = lVar18 + 2;
                      } while (lVar18 != 0x40);
                    }
                    else {
                      uVar26 = 1 << ((char)uVar20 - 6U & 0x1f);
                      lVar18 = 0;
                      uVar37 = 0;
                      uVar43 = 1;
                      do {
                        uVar44 = uVar26 & uVar37;
                        uVar45 = uVar26 & uVar43;
                        puVar3 = (uint *)(lVar19 + lVar18 * 8);
                        *puVar3 = -(uint)(uVar44 == 0) ^ 0xffffffff;
                        puVar3[1] = -(uint)(uVar44 == 0) ^ 0xffffffff;
                        puVar3[2] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                        puVar3[3] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                        lVar18 = lVar18 + 2;
                        uVar37 = uVar37 + 2;
                        uVar43 = uVar43 + 2;
                      } while (lVar18 != 0x40);
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != 0xc);
                }
                if (0 < (int)uVar34) {
                  lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar36];
                  uVar20 = 0;
                  do {
                    pTruth[uVar20] =
                         (local_238[uVar20] ^ (&local_438[0].tv_sec)[uVar20]) &
                         *(ulong *)(lVar19 + uVar20 * 8) ^ (&local_438[0].tv_sec)[uVar20];
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
              }
              else {
                sprintf(local_4c0,"(!%c%c)",(ulong)(pVars[uVar33] + 0x61),
                        (ulong)(pVars[uVar36] + 0x61));
                auVar7 = _DAT_007ee2e0;
                if (uVar34 == 1) {
                  uVar20 = (s_Truths6Neg[uVar33] & *pTruth) << (bVar12 & 0x3f) |
                           s_Truths6Neg[uVar33] & *pTruth;
                  uVar27 = s_Truths6Neg[uVar36] & uVar20;
                  bVar13 = (byte)(1 << (bVar13 & 0x1f));
                  uVar20 = uVar20 & s_Truths6[uVar36];
                  local_438[0].tv_sec = uVar27 << (bVar13 & 0x3f) | uVar27;
                  local_238[0] = uVar20 >> (bVar13 & 0x3f) | uVar20;
                }
                else {
                  if (uVar15 < 7) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar33];
                      uVar27 = 0;
                      do {
                        (&local_438[0].tv_sec)[uVar27] =
                             (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) | pTruth[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    ptVar21 = local_438;
                    pwVar16 = pTruth;
                    p_Var28 = local_458;
                    do {
                      if (iVar8 != 0x1f) {
                        uVar20 = 0;
                        do {
                          wVar4 = pwVar16[uVar20];
                          (&ptVar21->tv_sec)[uVar20] = wVar4;
                          p_Var28[uVar20] = wVar4;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pwVar16 = pwVar16 + iVar25;
                      p_Var28 = p_Var28 + iVar25;
                      ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar25);
                    } while (pwVar16 < pTruth + (int)uVar34);
                  }
                  if (u < 6) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar36];
                      uVar27 = 0;
                      do {
                        uVar35 = (&local_438[0].tv_sec)[uVar27] & uVar20;
                        (&local_438[0].tv_sec)[uVar27] =
                             uVar35 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar35;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    bVar14 = (byte)(u + -6);
                    uVar37 = 1 << (bVar14 & 0x1f);
                    iVar9 = 2 << (bVar14 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar37) {
                      uVar20 = (ulong)uVar37;
                    }
                    p_Var28 = &local_438[0].tv_sec + (int)uVar37;
                    ptVar21 = local_438;
                    do {
                      if (u + -6 != 0x1f) {
                        uVar27 = 0;
                        do {
                          p_Var28[uVar27] = (&ptVar21->tv_sec)[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar9);
                      p_Var28 = p_Var28 + iVar9;
                    } while (ptVar21 < (timespec *)(&local_438[0].tv_sec + (int)uVar34));
                  }
                  if (uVar15 < 7) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar33];
                      uVar27 = 0;
                      do {
                        local_238[uVar27] =
                             (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) | pTruth[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    pwVar16 = pTruth;
                    puVar22 = local_238;
                    puVar30 = local_460;
                    do {
                      if (iVar8 != 0x1f) {
                        uVar20 = 0;
                        do {
                          uVar27 = pwVar16[uVar20];
                          puVar22[uVar20] = uVar27;
                          puVar30[uVar20] = uVar27;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pwVar16 = pwVar16 + iVar25;
                      puVar30 = puVar30 + iVar25;
                      puVar22 = puVar22 + iVar25;
                    } while (pwVar16 < pTruth + (int)uVar34);
                  }
                  if (u < 6) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6[uVar36];
                      uVar27 = 0;
                      do {
                        local_238[uVar27] =
                             (local_238[uVar27] & uVar20) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                             local_238[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    bVar13 = (byte)(u + -6);
                    uVar37 = 1 << (bVar13 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar37) {
                      uVar20 = (ulong)uVar37;
                    }
                    puVar22 = local_238;
                    do {
                      if (u + -6 != 0x1f) {
                        uVar27 = 0;
                        do {
                          puVar22[uVar27] = puVar22[(long)(int)uVar37 + uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      puVar22 = puVar22 + (2 << (bVar13 & 0x1f));
                    } while (puVar22 < local_238 + (int)uVar34);
                  }
                }
                if (Dau_DsdTtElems_pTtElems == 0) {
                  lVar19 = 1;
                  puVar17 = Dau_DsdTtElems_TtElems;
                  auVar39 = _DAT_007ee2d0;
                  do {
                    if (SUB164(auVar39 ^ auVar7,4) == local_4a8 &&
                        SUB164(auVar39 ^ auVar7,0) < -0x7ffffff3) {
                      *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar19 * 8 + 0x19f8) = puVar17;
                      (&Dau_DsdTtElems_pTtElems)[lVar19] = (long)(puVar17 + 0x200);
                    }
                    lVar18 = auVar39._8_8_;
                    auVar39._0_8_ = auVar39._0_8_ + 2;
                    auVar39._8_8_ = lVar18 + 2;
                    lVar19 = lVar19 + 2;
                    puVar17 = puVar17 + 0x400;
                  } while (lVar19 != 0xf);
                  uVar20 = 0;
                  do {
                    lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar20];
                    if (uVar20 < 6) {
                      wVar4 = s_Truths6[uVar20];
                      uVar6 = *(undefined4 *)((long)s_Truths6 + uVar20 * 8 + 4);
                      lVar18 = 0;
                      do {
                        puVar2 = (undefined4 *)(lVar19 + lVar18 * 8);
                        *puVar2 = (int)wVar4;
                        puVar2[1] = uVar6;
                        puVar2[2] = (int)wVar4;
                        puVar2[3] = uVar6;
                        lVar18 = lVar18 + 2;
                      } while (lVar18 != 0x40);
                    }
                    else {
                      uVar26 = 1 << ((char)uVar20 - 6U & 0x1f);
                      lVar18 = 0;
                      uVar37 = 0;
                      uVar43 = 1;
                      do {
                        uVar44 = uVar26 & uVar37;
                        uVar45 = uVar26 & uVar43;
                        puVar3 = (uint *)(lVar19 + lVar18 * 8);
                        *puVar3 = -(uint)(uVar44 == 0) ^ 0xffffffff;
                        puVar3[1] = -(uint)(uVar44 == 0) ^ 0xffffffff;
                        puVar3[2] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                        puVar3[3] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                        lVar18 = lVar18 + 2;
                        uVar37 = uVar37 + 2;
                        uVar43 = uVar43 + 2;
                      } while (lVar18 != 0x40);
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != 0xc);
                }
                if (0 < (int)uVar34) {
                  lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar36];
                  uVar20 = 0;
                  do {
                    pTruth[uVar20] =
                         (local_238[uVar20] ^ (&local_438[0].tv_sec)[uVar20]) &
                         *(ulong *)(lVar19 + uVar20 * 8) ^ (&local_438[0].tv_sec)[uVar20];
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
              }
LAB_004a2293:
              if (local_4c0[0] == '\0') {
                __assert_fail("pBuffer[0]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                              ,0x699,
                              "int Dau_DsdDecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                             );
              }
              sVar11 = strlen(local_4c0);
              if (7 < sVar11) {
                __assert_fail("strlen(pStr) < 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                              ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              uVar34 = p->nVarsUsed;
              uVar24 = (ulong)(int)uVar34;
              if (0x1f < (long)uVar24) {
                __assert_fail("p->nVarsUsed < 32",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                              ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              uVar20 = uVar24;
              if (0 < (int)uVar34) {
                lVar19 = 0;
                do {
                  pacVar1[(int)uVar24][lVar19] = '\0';
                  lVar19 = lVar19 + 1;
                  uVar34 = p->nVarsUsed;
                  uVar24 = (ulong)uVar34;
                } while (lVar19 < (int)uVar34);
                uVar20 = (long)(int)uVar34;
                if (0 < (int)uVar34) {
                  lVar19 = 0;
                  pacVar23 = pacVar1;
                  do {
                    (*pacVar23)[(int)uVar24] = '\0';
                    lVar19 = lVar19 + 1;
                    uVar34 = p->nVarsUsed;
                    uVar24 = (ulong)uVar34;
                    uVar20 = (ulong)(int)uVar34;
                    pacVar23 = pacVar23 + 1;
                  } while (lVar19 < (long)uVar20);
                }
              }
              p->nVarsUsed = uVar34 + 1;
              strcpy(local_448[uVar20],local_4c0);
              pTruth = local_440;
              pVars[uVar36] = p->nVarsUsed + -1;
              uVar37 = uVar31 - 1;
              pVars[uVar33] = pVars[(long)(int)uVar31 + -1];
              Abc_TtSwapVars(local_440,uVar31,v,uVar37);
              iVar9 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,uVar37,u);
              if (iVar9 != 0) {
                uVar37 = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,uVar31 - 2);
              }
            }
            else {
              if (iVar9 == 2) {
                iVar9 = Abc_TtCheckEqualCofs(pTruth,uVar34,u,v,0,2);
                if (iVar9 == 0) {
                  iVar9 = Abc_TtCheckEqualCofs(pTruth,uVar34,u,v,0,3);
                  if (iVar9 == 0) goto LAB_004a23aa;
                  sprintf(local_4c0,"(%c!%c)",(ulong)(pVars[uVar33] + 0x61),
                          (ulong)(pVars[uVar36] + 0x61));
                  auVar7 = _DAT_007ee2e0;
                  if (uVar34 == 1) {
                    uVar20 = s_Truths6Neg[uVar33] & *pTruth;
                    uVar20 = (uVar20 << (bVar12 & 0x3f) | uVar20) & s_Truths6Neg[uVar36];
                    bVar13 = (byte)(1 << (bVar13 & 0x1f));
                    uVar27 = *pTruth & s_Truths6[uVar33];
                    uVar27 = (uVar27 >> (bVar12 & 0x3f) | uVar27) & s_Truths6Neg[uVar36];
                    local_438[0].tv_sec = uVar20 << (bVar13 & 0x3f) | uVar20;
                    local_238[0] = uVar27 << (bVar13 & 0x3f) | uVar27;
                  }
                  else {
                    if (uVar15 < 7) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6Neg[uVar33];
                        uVar27 = 0;
                        do {
                          (&local_438[0].tv_sec)[uVar27] =
                               (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) |
                               pTruth[uVar27] & uVar20;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      ptVar21 = local_438;
                      pwVar16 = pTruth;
                      p_Var28 = local_488;
                      do {
                        if (iVar8 != 0x1f) {
                          uVar20 = 0;
                          do {
                            wVar4 = pwVar16[uVar20];
                            (&ptVar21->tv_sec)[uVar20] = wVar4;
                            p_Var28[uVar20] = wVar4;
                            uVar20 = uVar20 + 1;
                          } while (uVar32 != uVar20);
                        }
                        pwVar16 = pwVar16 + iVar25;
                        p_Var28 = p_Var28 + iVar25;
                        ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar25);
                      } while (pwVar16 < pTruth + (int)uVar34);
                    }
                    if (u < 6) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6Neg[uVar36];
                        uVar27 = 0;
                        do {
                          uVar35 = (&local_438[0].tv_sec)[uVar27] & uVar20;
                          (&local_438[0].tv_sec)[uVar27] =
                               uVar35 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar35;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      bVar14 = (byte)(u + -6);
                      uVar37 = 1 << (bVar14 & 0x1f);
                      iVar9 = 2 << (bVar14 & 0x1f);
                      uVar20 = 1;
                      if (1 < (int)uVar37) {
                        uVar20 = (ulong)uVar37;
                      }
                      p_Var28 = &local_438[0].tv_sec + (int)uVar37;
                      ptVar21 = local_438;
                      do {
                        if (u + -6 != 0x1f) {
                          uVar27 = 0;
                          do {
                            p_Var28[uVar27] = (&ptVar21->tv_sec)[uVar27];
                            uVar27 = uVar27 + 1;
                          } while (uVar20 != uVar27);
                        }
                        ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar9);
                        p_Var28 = p_Var28 + iVar9;
                      } while (ptVar21 < (timespec *)(&local_438[0].tv_sec + (int)uVar34));
                    }
                    if (uVar15 < 7) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6[uVar33];
                        uVar27 = 0;
                        do {
                          local_238[uVar27] =
                               (pTruth[uVar27] & uVar20) >> (bVar12 & 0x3f) |
                               pTruth[uVar27] & uVar20;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      pwVar16 = pTruth;
                      puVar22 = local_238;
                      do {
                        pwVar29 = pwVar16;
                        puVar30 = puVar22;
                        uVar20 = uVar32;
                        if (iVar8 != 0x1f) {
                          do {
                            uVar27 = *(ulong *)((long)pwVar29 + local_490);
                            *puVar30 = uVar27;
                            *(ulong *)((long)puVar30 + local_490) = uVar27;
                            uVar20 = uVar20 - 1;
                            pwVar29 = pwVar29 + 1;
                            puVar30 = puVar30 + 1;
                          } while (uVar20 != 0);
                        }
                        pwVar16 = pwVar16 + iVar25;
                        puVar22 = puVar22 + iVar25;
                      } while (pwVar16 < pTruth + (int)uVar34);
                    }
                    if (u < 6) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6Neg[uVar36];
                        uVar27 = 0;
                        do {
                          local_238[uVar27] =
                               (local_238[uVar27] & uVar20) << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f)
                               | local_238[uVar27] & uVar20;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      bVar13 = (byte)(u + -6);
                      uVar37 = 1 << (bVar13 & 0x1f);
                      iVar9 = 2 << (bVar13 & 0x1f);
                      uVar20 = 1;
                      if (1 < (int)uVar37) {
                        uVar20 = (ulong)uVar37;
                      }
                      puVar22 = local_238 + (int)uVar37;
                      puVar30 = local_238;
                      do {
                        if (u + -6 != 0x1f) {
                          uVar27 = 0;
                          do {
                            puVar22[uVar27] = puVar30[uVar27];
                            uVar27 = uVar27 + 1;
                          } while (uVar20 != uVar27);
                        }
                        puVar30 = puVar30 + iVar9;
                        puVar22 = puVar22 + iVar9;
                      } while (puVar30 < local_238 + (int)uVar34);
                    }
                  }
                  if (Dau_DsdTtElems_pTtElems == 0) {
                    lVar19 = 1;
                    puVar17 = Dau_DsdTtElems_TtElems;
                    auVar41 = _DAT_007ee2d0;
                    do {
                      if (SUB164(auVar41 ^ auVar7,4) == local_4a8 &&
                          SUB164(auVar41 ^ auVar7,0) < -0x7ffffff3) {
                        *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar19 * 8 + 0x19f8) = puVar17;
                        (&Dau_DsdTtElems_pTtElems)[lVar19] = (long)(puVar17 + 0x200);
                      }
                      lVar18 = auVar41._8_8_;
                      auVar41._0_8_ = auVar41._0_8_ + 2;
                      auVar41._8_8_ = lVar18 + 2;
                      lVar19 = lVar19 + 2;
                      puVar17 = puVar17 + 0x400;
                    } while (lVar19 != 0xf);
                    uVar20 = 0;
                    do {
                      lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar20];
                      if (uVar20 < 6) {
                        wVar4 = s_Truths6[uVar20];
                        uVar6 = *(undefined4 *)((long)s_Truths6 + uVar20 * 8 + 4);
                        lVar18 = 0;
                        do {
                          puVar2 = (undefined4 *)(lVar19 + lVar18 * 8);
                          *puVar2 = (int)wVar4;
                          puVar2[1] = uVar6;
                          puVar2[2] = (int)wVar4;
                          puVar2[3] = uVar6;
                          lVar18 = lVar18 + 2;
                        } while (lVar18 != 0x40);
                      }
                      else {
                        uVar26 = 1 << ((char)uVar20 - 6U & 0x1f);
                        lVar18 = 0;
                        uVar37 = 0;
                        uVar43 = 1;
                        do {
                          uVar44 = uVar26 & uVar37;
                          uVar45 = uVar26 & uVar43;
                          puVar3 = (uint *)(lVar19 + lVar18 * 8);
                          *puVar3 = -(uint)(uVar44 == 0) ^ 0xffffffff;
                          puVar3[1] = -(uint)(uVar44 == 0) ^ 0xffffffff;
                          puVar3[2] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                          puVar3[3] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                          lVar18 = lVar18 + 2;
                          uVar37 = uVar37 + 2;
                          uVar43 = uVar43 + 2;
                        } while (lVar18 != 0x40);
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != 0xc);
                  }
                  if (0 < (int)uVar34) {
                    lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar36];
                    uVar20 = 0;
                    do {
                      pTruth[uVar20] =
                           (local_238[uVar20] ^ (&local_438[0].tv_sec)[uVar20]) &
                           *(ulong *)(lVar19 + uVar20 * 8) ^ (&local_438[0].tv_sec)[uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar24 != uVar20);
                  }
                }
                else {
                  sprintf(local_4c0,"(%c%c)",(ulong)(pVars[uVar33] + 0x61),
                          (ulong)(pVars[uVar36] + 0x61));
                  auVar7 = _DAT_007ee2e0;
                  if (uVar34 == 1) {
                    uVar20 = s_Truths6Neg[uVar33] & *pTruth;
                    uVar20 = (uVar20 << (bVar12 & 0x3f) | uVar20) & s_Truths6Neg[uVar36];
                    bVar13 = (byte)(1 << (bVar13 & 0x1f));
                    uVar27 = *pTruth & s_Truths6[uVar33];
                    uVar27 = (uVar27 >> (bVar12 & 0x3f) | uVar27) & s_Truths6[uVar36];
                    local_438[0].tv_sec = uVar20 << (bVar13 & 0x3f) | uVar20;
                    local_238[0] = uVar27 >> (bVar13 & 0x3f) | uVar27;
                  }
                  else {
                    if (uVar15 < 7) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6Neg[uVar33];
                        uVar27 = 0;
                        do {
                          (&local_438[0].tv_sec)[uVar27] =
                               (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) |
                               pTruth[uVar27] & uVar20;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      ptVar21 = local_438;
                      pwVar16 = pTruth;
                      p_Var28 = local_468;
                      do {
                        if (iVar8 != 0x1f) {
                          uVar20 = 0;
                          do {
                            wVar4 = pwVar16[uVar20];
                            (&ptVar21->tv_sec)[uVar20] = wVar4;
                            p_Var28[uVar20] = wVar4;
                            uVar20 = uVar20 + 1;
                          } while (uVar32 != uVar20);
                        }
                        pwVar16 = pwVar16 + iVar25;
                        p_Var28 = p_Var28 + iVar25;
                        ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar25);
                      } while (pwVar16 < pTruth + (int)uVar34);
                    }
                    if (u < 6) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6Neg[uVar36];
                        uVar27 = 0;
                        do {
                          uVar35 = (&local_438[0].tv_sec)[uVar27] & uVar20;
                          (&local_438[0].tv_sec)[uVar27] =
                               uVar35 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar35;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      bVar14 = (byte)(u + -6);
                      uVar37 = 1 << (bVar14 & 0x1f);
                      iVar9 = 2 << (bVar14 & 0x1f);
                      uVar20 = 1;
                      if (1 < (int)uVar37) {
                        uVar20 = (ulong)uVar37;
                      }
                      p_Var28 = &local_438[0].tv_sec + (int)uVar37;
                      ptVar21 = local_438;
                      do {
                        if (u + -6 != 0x1f) {
                          uVar27 = 0;
                          do {
                            p_Var28[uVar27] = (&ptVar21->tv_sec)[uVar27];
                            uVar27 = uVar27 + 1;
                          } while (uVar20 != uVar27);
                        }
                        ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar9);
                        p_Var28 = p_Var28 + iVar9;
                      } while (ptVar21 < (timespec *)(&local_438[0].tv_sec + (int)uVar34));
                    }
                    if (uVar15 < 7) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6[uVar33];
                        uVar27 = 0;
                        do {
                          local_238[uVar27] =
                               (pTruth[uVar27] & uVar20) >> (bVar12 & 0x3f) |
                               pTruth[uVar27] & uVar20;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      pwVar16 = pTruth;
                      puVar22 = local_238;
                      do {
                        pwVar29 = pwVar16;
                        puVar30 = puVar22;
                        uVar20 = uVar32;
                        if (iVar8 != 0x1f) {
                          do {
                            uVar27 = *(ulong *)((long)pwVar29 + local_490);
                            *puVar30 = uVar27;
                            *(ulong *)((long)puVar30 + local_490) = uVar27;
                            uVar20 = uVar20 - 1;
                            pwVar29 = pwVar29 + 1;
                            puVar30 = puVar30 + 1;
                          } while (uVar20 != 0);
                        }
                        pwVar16 = pwVar16 + iVar25;
                        puVar22 = puVar22 + iVar25;
                      } while (pwVar16 < pTruth + (int)uVar34);
                    }
                    if (u < 6) {
                      if (0 < (int)uVar34) {
                        uVar20 = s_Truths6[uVar36];
                        uVar27 = 0;
                        do {
                          local_238[uVar27] =
                               (local_238[uVar27] & uVar20) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f)
                               | local_238[uVar27] & uVar20;
                          uVar27 = uVar27 + 1;
                        } while (uVar24 != uVar27);
                      }
                    }
                    else if (0 < (int)uVar34) {
                      bVar13 = (byte)(u + -6);
                      uVar37 = 1 << (bVar13 & 0x1f);
                      uVar20 = 1;
                      if (1 < (int)uVar37) {
                        uVar20 = (ulong)uVar37;
                      }
                      puVar22 = local_238;
                      do {
                        if (u + -6 != 0x1f) {
                          uVar27 = 0;
                          do {
                            puVar22[uVar27] = puVar22[(long)(int)uVar37 + uVar27];
                            uVar27 = uVar27 + 1;
                          } while (uVar20 != uVar27);
                        }
                        puVar22 = puVar22 + (2 << (bVar13 & 0x1f));
                      } while (puVar22 < local_238 + (int)uVar34);
                    }
                  }
                  if (Dau_DsdTtElems_pTtElems == 0) {
                    lVar19 = 1;
                    puVar17 = Dau_DsdTtElems_TtElems;
                    auVar38 = _DAT_007ee2d0;
                    do {
                      if (SUB164(auVar38 ^ auVar7,4) == local_4a8 &&
                          SUB164(auVar38 ^ auVar7,0) < -0x7ffffff3) {
                        *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar19 * 8 + 0x19f8) = puVar17;
                        (&Dau_DsdTtElems_pTtElems)[lVar19] = (long)(puVar17 + 0x200);
                      }
                      lVar18 = auVar38._8_8_;
                      auVar38._0_8_ = auVar38._0_8_ + 2;
                      auVar38._8_8_ = lVar18 + 2;
                      lVar19 = lVar19 + 2;
                      puVar17 = puVar17 + 0x400;
                    } while (lVar19 != 0xf);
                    uVar20 = 0;
                    do {
                      lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar20];
                      if (uVar20 < 6) {
                        wVar4 = s_Truths6[uVar20];
                        uVar6 = *(undefined4 *)((long)s_Truths6 + uVar20 * 8 + 4);
                        lVar18 = 0;
                        do {
                          puVar2 = (undefined4 *)(lVar19 + lVar18 * 8);
                          *puVar2 = (int)wVar4;
                          puVar2[1] = uVar6;
                          puVar2[2] = (int)wVar4;
                          puVar2[3] = uVar6;
                          lVar18 = lVar18 + 2;
                        } while (lVar18 != 0x40);
                      }
                      else {
                        uVar26 = 1 << ((char)uVar20 - 6U & 0x1f);
                        lVar18 = 0;
                        uVar37 = 0;
                        uVar43 = 1;
                        do {
                          uVar44 = uVar26 & uVar37;
                          uVar45 = uVar26 & uVar43;
                          puVar3 = (uint *)(lVar19 + lVar18 * 8);
                          *puVar3 = -(uint)(uVar44 == 0) ^ 0xffffffff;
                          puVar3[1] = -(uint)(uVar44 == 0) ^ 0xffffffff;
                          puVar3[2] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                          puVar3[3] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                          lVar18 = lVar18 + 2;
                          uVar37 = uVar37 + 2;
                          uVar43 = uVar43 + 2;
                        } while (lVar18 != 0x40);
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != 0xc);
                  }
                  if (0 < (int)uVar34) {
                    lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar36];
                    uVar20 = 0;
                    do {
                      pTruth[uVar20] =
                           (local_238[uVar20] ^ (&local_438[0].tv_sec)[uVar20]) &
                           *(ulong *)(lVar19 + uVar20 * 8) ^ (&local_438[0].tv_sec)[uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar24 != uVar20);
                  }
                }
                goto LAB_004a2293;
              }
              if (((iVar9 == 3) && (iVar9 = Abc_TtCheckEqualCofs(pTruth,uVar34,u,v,0,3), iVar9 != 0)
                  ) && (iVar9 = Abc_TtCheckEqualCofs(pTruth,uVar34,u,v,1,2), iVar9 != 0)) {
                sprintf(local_4c0,"[%c%c]",(ulong)(pVars[uVar33] + 0x61),
                        (ulong)(pVars[uVar36] + 0x61));
                auVar7 = _DAT_007ee2e0;
                if (uVar34 == 1) {
                  uVar20 = (s_Truths6Neg[uVar33] & *pTruth) << (bVar12 & 0x3f) |
                           s_Truths6Neg[uVar33] & *pTruth;
                  uVar27 = s_Truths6Neg[uVar36] & uVar20;
                  bVar13 = (byte)(1 << (bVar13 & 0x1f));
                  uVar20 = uVar20 & s_Truths6[uVar36];
                  local_438[0].tv_sec = uVar27 << (bVar13 & 0x3f) | uVar27;
                  local_238[0] = uVar20 >> (bVar13 & 0x3f) | uVar20;
                }
                else {
                  if (uVar15 < 7) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar33];
                      uVar27 = 0;
                      do {
                        (&local_438[0].tv_sec)[uVar27] =
                             (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) | pTruth[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    ptVar21 = local_438;
                    pwVar16 = pTruth;
                    p_Var28 = local_470;
                    do {
                      if (iVar8 != 0x1f) {
                        uVar20 = 0;
                        do {
                          wVar4 = pwVar16[uVar20];
                          (&ptVar21->tv_sec)[uVar20] = wVar4;
                          p_Var28[uVar20] = wVar4;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pwVar16 = pwVar16 + iVar25;
                      p_Var28 = p_Var28 + iVar25;
                      ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar25);
                    } while (pwVar16 < pTruth + (int)uVar34);
                  }
                  if (u < 6) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar36];
                      uVar27 = 0;
                      do {
                        uVar35 = (&local_438[0].tv_sec)[uVar27] & uVar20;
                        (&local_438[0].tv_sec)[uVar27] =
                             uVar35 << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) | uVar35;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    bVar14 = (byte)(u + -6);
                    uVar37 = 1 << (bVar14 & 0x1f);
                    iVar9 = 2 << (bVar14 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar37) {
                      uVar20 = (ulong)uVar37;
                    }
                    p_Var28 = &local_438[0].tv_sec + (int)uVar37;
                    ptVar21 = local_438;
                    do {
                      if (u + -6 != 0x1f) {
                        uVar27 = 0;
                        do {
                          p_Var28[uVar27] = (&ptVar21->tv_sec)[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      ptVar21 = (timespec *)(&ptVar21->tv_sec + iVar9);
                      p_Var28 = p_Var28 + iVar9;
                    } while (ptVar21 < (timespec *)(&local_438[0].tv_sec + (int)uVar34));
                  }
                  if (uVar15 < 7) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6Neg[uVar33];
                      uVar27 = 0;
                      do {
                        local_238[uVar27] =
                             (pTruth[uVar27] & uVar20) << (bVar12 & 0x3f) | pTruth[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    pwVar16 = pTruth;
                    puVar22 = local_238;
                    puVar30 = local_478;
                    do {
                      if (iVar8 != 0x1f) {
                        uVar20 = 0;
                        do {
                          uVar27 = pwVar16[uVar20];
                          puVar22[uVar20] = uVar27;
                          puVar30[uVar20] = uVar27;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pwVar16 = pwVar16 + iVar25;
                      puVar30 = puVar30 + iVar25;
                      puVar22 = puVar22 + iVar25;
                    } while (pwVar16 < pTruth + (int)uVar34);
                  }
                  if (u < 6) {
                    if (0 < (int)uVar34) {
                      uVar20 = s_Truths6[uVar36];
                      uVar27 = 0;
                      do {
                        local_238[uVar27] =
                             (local_238[uVar27] & uVar20) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
                             local_238[uVar27] & uVar20;
                        uVar27 = uVar27 + 1;
                      } while (uVar24 != uVar27);
                    }
                  }
                  else if (0 < (int)uVar34) {
                    bVar13 = (byte)(u + -6);
                    uVar37 = 1 << (bVar13 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar37) {
                      uVar20 = (ulong)uVar37;
                    }
                    puVar22 = local_238;
                    do {
                      if (u + -6 != 0x1f) {
                        uVar27 = 0;
                        do {
                          puVar22[uVar27] = puVar22[(long)(int)uVar37 + uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      puVar22 = puVar22 + (2 << (bVar13 & 0x1f));
                    } while (puVar22 < local_238 + (int)uVar34);
                  }
                }
                if (Dau_DsdTtElems_pTtElems == 0) {
                  lVar19 = 1;
                  puVar17 = Dau_DsdTtElems_TtElems;
                  auVar40 = _DAT_007ee2d0;
                  do {
                    if (SUB164(auVar40 ^ auVar7,4) == local_4a8 &&
                        SUB164(auVar40 ^ auVar7,0) < -0x7ffffff3) {
                      *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar19 * 8 + 0x19f8) = puVar17;
                      (&Dau_DsdTtElems_pTtElems)[lVar19] = (long)(puVar17 + 0x200);
                    }
                    lVar18 = auVar40._8_8_;
                    auVar40._0_8_ = auVar40._0_8_ + 2;
                    auVar40._8_8_ = lVar18 + 2;
                    lVar19 = lVar19 + 2;
                    puVar17 = puVar17 + 0x400;
                  } while (lVar19 != 0xf);
                  uVar20 = 0;
                  do {
                    lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar20];
                    if (uVar20 < 6) {
                      wVar4 = s_Truths6[uVar20];
                      uVar6 = *(undefined4 *)((long)s_Truths6 + uVar20 * 8 + 4);
                      lVar18 = 0;
                      do {
                        puVar2 = (undefined4 *)(lVar19 + lVar18 * 8);
                        *puVar2 = (int)wVar4;
                        puVar2[1] = uVar6;
                        puVar2[2] = (int)wVar4;
                        puVar2[3] = uVar6;
                        lVar18 = lVar18 + 2;
                      } while (lVar18 != 0x40);
                    }
                    else {
                      uVar26 = 1 << ((char)uVar20 - 6U & 0x1f);
                      lVar18 = 0;
                      uVar37 = 0;
                      uVar43 = 1;
                      do {
                        uVar44 = uVar26 & uVar37;
                        uVar45 = uVar26 & uVar43;
                        puVar3 = (uint *)(lVar19 + lVar18 * 8);
                        *puVar3 = -(uint)(uVar44 == 0) ^ 0xffffffff;
                        puVar3[1] = -(uint)(uVar44 == 0) ^ 0xffffffff;
                        puVar3[2] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                        puVar3[3] = -(uint)(uVar45 == 0) ^ 0xffffffff;
                        lVar18 = lVar18 + 2;
                        uVar37 = uVar37 + 2;
                        uVar43 = uVar43 + 2;
                      } while (lVar18 != 0x40);
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != 0xc);
                }
                if (0 < (int)uVar34) {
                  lVar19 = (&Dau_DsdTtElems_pTtElems)[uVar36];
                  uVar20 = 0;
                  do {
                    pTruth[uVar20] =
                         (local_238[uVar20] ^ (&local_438[0].tv_sec)[uVar20]) &
                         *(ulong *)(lVar19 + uVar20 * 8) ^ (&local_438[0].tv_sec)[uVar20];
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                goto LAB_004a2293;
              }
            }
LAB_004a23aa:
            if (uVar37 == 0) {
              iVar8 = clock_gettime(3,local_438);
              if (iVar8 < 0) {
                lVar19 = -1;
              }
              else {
                lVar19 = local_438[0].tv_nsec / 1000 + local_438[0].tv_sec * 1000000;
              }
              iVar8 = 0;
              goto LAB_004a24b2;
            }
            uVar24 = (ulong)uVar37;
            if ((int)uVar37 < (int)uVar31) {
              uVar24 = (ulong)uVar37;
              goto LAB_004a2407;
            }
          }
          uVar36 = uVar36 - 1;
        } while (0 < u);
        uVar34 = (int)local_450 - 1;
        uVar32 = uVar10 - 1;
        uVar15 = uVar10;
      } while (1 < v);
    }
    v = (int)uVar32;
LAB_004a2407:
  } while (v != 0);
  iVar8 = (int)uVar24;
  iVar25 = clock_gettime(3,local_438);
  if (iVar25 < 0) {
    lVar19 = -1;
  }
  else {
    lVar19 = local_438[0].tv_nsec / 1000 + local_438[0].tv_sec * 1000000;
  }
LAB_004a24b2:
  s_Times_1 = s_Times_1 + lVar19 + local_4b0;
  return iVar8;
}

Assistant:

int Dau_DsdDecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_DsdDecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}